

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O3

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::makeBlock
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,optional<wasm::Name> label,HeapType type)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  HeapTypeKind HVar3;
  Signature sig;
  Name label_00;
  _Variant_storage<false,_wasm::Ok,_wasm::Err> local_a8;
  Err local_80;
  string local_60;
  HeapType local_40;
  HeapType type_local;
  
  local_40.id = type.id;
  HVar3 = HeapType::getKind(&local_40);
  if (HVar3 == Func) {
    type_local.id = (uintptr_t)&this->irBuilder;
    if (label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._M_engaged == false) {
      label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len = 0;
      label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_str =
           (char *)0x0;
    }
    sig = HeapType::getSignature(&local_40);
    label_00.super_IString.str._M_str =
         label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_str;
    label_00.super_IString.str._M_len =
         label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len;
    IRBuilder::makeBlock((Result<wasm::Ok> *)&local_a8,(IRBuilder *)type_local.id,label_00,sig);
    withLoc<wasm::Ok>(__return_storage_ptr__,this,pos,(Result<wasm::Ok> *)&local_a8);
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              (&local_a8);
  }
  else {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"expected function type","")
    ;
    Lexer::err(&local_80,&this->in,(ulong)pos,&local_60);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
    paVar2 = &local_80.msg.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.msg._M_dataplus._M_p == paVar2) {
      *puVar1 = CONCAT71(local_80.msg.field_2._M_allocated_capacity._1_7_,
                         local_80.msg.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
           local_80.msg.field_2._8_8_;
    }
    else {
      *(pointer *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_80.msg._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
           CONCAT71(local_80.msg.field_2._M_allocated_capacity._1_7_,
                    local_80.msg.field_2._M_local_buf[0]);
    }
    *(size_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_80.msg._M_string_length
    ;
    local_80.msg._M_string_length = 0;
    local_80.msg.field_2._M_local_buf[0] = '\0';
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      local_80.msg._M_dataplus._M_p = (pointer)paVar2;
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> makeBlock(Index pos,
                     const std::vector<Annotation>& annotations,
                     std::optional<Name> label,
                     HeapType type) {
    // TODO: validate labels?
    // TODO: Move error on input types to here?
    if (!type.isSignature()) {
      return in.err(pos, "expected function type");
    }
    return withLoc(
      pos, irBuilder.makeBlock(label ? *label : Name{}, type.getSignature()));
  }